

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerStElemC(Lowerer *this,Instr *stElem)

{
  LowererMD *pLVar1;
  IRType IVar2;
  Instr *pIVar3;
  IndirOpnd *this_00;
  Func *func;
  Instr *insertBeforeInstr;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  IRType IVar7;
  byte bVar8;
  ObjectType OVar9;
  int32 iVar10;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  long value;
  Opnd *pOVar13;
  HelperCallOpnd *this_01;
  IntConstOpnd *pIVar14;
  LabelInstr *isNotObjectLabel;
  Instr *instr;
  LabelInstr *target;
  char *message;
  int iVar15;
  char *error;
  uint lineNumber;
  Lowerer *this_02;
  long lVar16;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pIVar3 = stElem->m_prev;
  this_00 = (IndirOpnd *)stElem->m_dst;
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar6) goto LAB_005c02a9;
    *puVar11 = 0;
  }
  pRVar12 = IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if (pRVar12 == (RegOpnd *)0x0) {
    iVar10 = this_00->m_offset;
  }
  else {
    bVar6 = StackSym::IsIntConst(pRVar12->m_sym);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bc6,"(!indexOpnd || indexOpnd->m_sym->IsIntConst())",
                         "!indexOpnd || indexOpnd->m_sym->IsIntConst()");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    OVar5 = IR::Opnd::GetKind(&pRVar12->super_Opnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    iVar10 = StackSym::GetIntConstValue(pRVar12->m_sym);
    IR::Opnd::Free(&pRVar12->super_Opnd,this->m_func);
  }
  value = (long)iVar10;
  if (stElem->m_kind == InstrKindJitProfiling) {
    if (*(short *)&stElem[1]._vptr_Instr != -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bd5,
                         "(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId)",
                         "stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    pLVar1 = &this->m_lowererMD;
    pOVar13 = IR::Instr::UnlinkSrc1(stElem);
    LowererMD::LoadHelperArgument(pLVar1,stElem,pOVar13);
    this_01 = IR::HelperCallOpnd::New
                        ((stElem->m_opcode != StElemC) + HelperSimpleStoreArrayHelper,this->m_func);
    if (stElem->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    func = stElem->m_func;
    if ((this_01->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    bVar8 = (this_01->super_Opnd).field_0xb;
    if ((bVar8 & 2) != 0) {
      this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
      bVar8 = (this_01->super_Opnd).field_0xb;
    }
    (this_01->super_Opnd).field_0xb = bVar8 | 2;
    stElem->m_src1 = &this_01->super_Opnd;
    pIVar14 = IR::IntConstOpnd::New(value,TyUint32,this->m_func,false);
    LowererMD::LoadHelperArgument(pLVar1,stElem,&pIVar14->super_Opnd);
    pRVar12 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
    LowererMD::LoadHelperArgument(pLVar1,stElem,&pRVar12->super_Opnd);
    pOVar13 = IR::Instr::UnlinkDst(stElem);
    IR::Opnd::Free(pOVar13,this->m_func);
    LowererMD::LowerCall(pLVar1,stElem,0);
    return pIVar3;
  }
  pRVar12 = this_00->m_baseOpnd;
  local_32[0] = (pRVar12->super_Opnd).m_valueType.field_0;
  bVar6 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
  if (bVar6) {
    if (stElem->m_opcode != StElemC) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2bea,"(stElem->m_opcode == Js::OpCode::StElemC)",
                         "stElem->m_opcode == Js::OpCode::StElemC");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    if ((stElem->field_0x38 & 0x10) == 0) {
      isNotObjectLabel = (LabelInstr *)0x0;
      instr = stElem;
    }
    else {
      isNotObjectLabel = IR::LabelInstr::New(Label,this->m_func,true);
      instr = IR::Instr::New(stElem->m_opcode,this->m_func);
      IR::Instr::TransferTo(stElem,instr);
      IR::Instr::InsertBefore(stElem,instr);
      target = IR::LabelInstr::New(Label,this->m_func,false);
      InsertBranch(Br,false,target,stElem);
      IR::Instr::InsertBefore(stElem,&isNotObjectLabel->super_Instr);
      IR::Instr::InsertAfter(stElem,&target->super_Instr);
      stElem->m_opcode = BailOut;
      GenerateBailOut(this,stElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
    bVar6 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
    if (!bVar6) {
      if (isNotObjectLabel == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c04,"(labelBailOut)","labelBailOut");
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
      GenerateArrayTest(this,pRVar12,isNotObjectLabel,isNotObjectLabel,instr,true,false,false);
    }
    if (instr->m_src1->m_type == TyVar) {
      if (isNotObjectLabel == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c0f,"(labelBailOut)","labelBailOut");
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
      LoadScriptContext(this,instr);
      pLVar1 = &this->m_lowererMD;
      pOVar13 = IR::Instr::UnlinkSrc1(instr);
      LowererMD::LoadHelperArgument(pLVar1,instr,pOVar13);
      pIVar14 = IR::IntConstOpnd::New(value,TyUint32,this->m_func,false);
      LowererMD::LoadHelperArgument(pLVar1,instr,&pIVar14->super_Opnd);
      pRVar12 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
      LowererMD::LoadHelperArgument(pLVar1,instr,&pRVar12->super_Opnd);
      bVar6 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      insertBeforeInstr = instr->m_next;
      pRVar12 = IR::RegOpnd::New(TyUint32,this->m_func);
      IR::Instr::ReplaceDst(instr,&pRVar12->super_Opnd);
      LowererMD::ChangeToHelperCall
                (pLVar1,instr,bVar6 ^ HelperScrArr_SetNativeFloatElementC,(LabelInstr *)0x0,
                 (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      bVar6 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
      this_02 = (Lowerer *)((ulong)!bVar6 * 2 + 0x1e);
      pIVar14 = IR::IntConstOpnd::New((IntConstType)this_02,TyUint32,this->m_func,false);
      InsertCompareBranch(this_02,&pRVar12->super_Opnd,&pIVar14->super_Opnd,BrNeq_A,false,
                          isNotObjectLabel,insertBeforeInstr,false);
      return pIVar3;
    }
    bVar6 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    IVar2 = instr->m_src1->m_type;
    IVar7 = GetArrayIndirType((ValueType)local_32[0].field_0);
    if (isNotObjectLabel == (LabelInstr *)0x0 || !bVar6) {
      if (IVar2 != IVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c4c,
                           "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                           "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
    }
    else {
      if (IVar2 != IVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c38,
                           "(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType))",
                           "stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType)");
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
      pOVar13 = GetMissingItemOpnd(instr->m_src1->m_type,this->m_func);
      bVar6 = IR::Opnd::IsEqual(instr->m_src1,pOVar13);
      if (bVar6) {
        InsertBranch(Br,false,isNotObjectLabel,instr);
        isNotObjectLabel->field_0x78 = isNotObjectLabel->field_0x78 | 0x20;
        IR::Instr::Remove(instr);
        return pIVar3;
      }
      InsertMissingItemCompareBranch(this,instr->m_src1,BrEq_A,isNotObjectLabel,instr);
    }
    instr->m_dst->m_type = instr->m_src1->m_type;
    if (0x40 < iVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2c4f,"(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)",
                         "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE");
      if (!bVar6) goto LAB_005c02a9;
      *puVar11 = 0;
    }
    ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    lVar16 = 0x58;
    stElem = instr;
  }
  else {
    bVar6 = ValueType::IsLikelyObject((ValueType *)&local_32[0].field_0);
    if ((bVar6) &&
       (OVar9 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0), OVar9 == Array)) {
      if (stElem->m_opcode != StElemC) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c5c,"(stElem->m_opcode == Js::OpCode::StElemC)",
                           "stElem->m_opcode == Js::OpCode::StElemC");
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
      lVar16 = 0x50;
      if (0x40 < iVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        error = "(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE)";
        message = "value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE";
        lineNumber = 0x2c5d;
LAB_005bfd08:
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,lineNumber,error,message);
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
    }
    else {
      if ((stElem->m_opcode & ~ExtendedOpcodePrefix) != StElemC) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2c62,
                           "(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC)"
                           ,
                           "stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC"
                          );
        if (!bVar6) goto LAB_005c02a9;
        *puVar11 = 0;
      }
      lVar16 = 0x18;
      if ((this_00->m_baseOpnd->super_Opnd).m_type != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        error = "(indirOpnd->GetBaseOpnd()->GetType() == TyVar)";
        message = "indirOpnd->GetBaseOpnd()->GetType() == TyVar";
        lineNumber = 0x2c63;
        goto LAB_005bfd08;
      }
    }
  }
  if (iVar10 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c66,"(value >= 0)","value >= 0");
    if (!bVar6) goto LAB_005c02a9;
    *puVar11 = 0;
  }
  bVar6 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (bVar6) {
    bVar8 = GetArrayIndirScale((ValueType)local_32[0].field_0);
  }
  else {
    bVar8 = LowererMDArch::GetDefaultIndirScale();
  }
  lVar16 = (value << (bVar8 & 0x3f)) + lVar16;
  iVar15 = (int)lVar16;
  if (iVar15 != lVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c6c,"(Math::FitsInDWord(offset))","Math::FitsInDWord(offset)");
    if (!bVar6) {
LAB_005c02a9:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  this_00->m_offset = iVar15;
  (this_00->super_Opnd).field_0xe = 0;
  LowererMD::ChangeToWriteBarrierAssign(stElem,this->m_func);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerStElemC(IR::Instr * stElem)
{
    IR::Instr *instrPrev = stElem->m_prev;
    IR::IndirOpnd * indirOpnd = stElem->GetDst()->AsIndirOpnd();
    IR::RegOpnd *indexOpnd = indirOpnd->UnlinkIndexOpnd();

    Assert(!indexOpnd || indexOpnd->m_sym->IsIntConst());

    IntConstType value;
    if (indexOpnd)
    {
        value = indexOpnd->AsRegOpnd()->m_sym->GetIntConstValue();
        indexOpnd->Free(this->m_func);
    }
    else
    {
        value = (IntConstType)indirOpnd->GetOffset();
    }

    if (stElem->IsJitProfilingInstr())
    {
        Assert(stElem->AsJitProfilingInstr()->profileId == Js::Constants::NoProfileId);
        m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

        const auto meth = stElem->m_opcode == Js::OpCode::StElemC ? IR::HelperSimpleStoreArrayHelper : IR::HelperSimpleStoreArraySegHelper;

        stElem->SetSrc1(IR::HelperCallOpnd::New(meth, m_func));

        m_lowererMD.LoadHelperArgument(stElem, IR::IntConstOpnd::New(value, TyUint32, m_func));
        m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

        stElem->UnlinkDst()->Free(m_func);

        m_lowererMD.LowerCall(stElem, 0);
        return instrPrev;
    }

    IntConstType base;
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsLikelyNativeArray())
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);

        IR::LabelInstr *labelBailOut = nullptr;
        IR::Instr *instrBailOut = nullptr;

        if (stElem->HasBailOutInfo())
        {
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
            instrBailOut = stElem;
            stElem = IR::Instr::New(instrBailOut->m_opcode, m_func);
            instrBailOut->TransferTo(stElem);
            instrBailOut->InsertBefore(stElem);

            IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertBranch(Js::OpCode::Br, labelDone, instrBailOut);

            instrBailOut->InsertBefore(labelBailOut);
            instrBailOut->InsertAfter(labelDone);

            instrBailOut->m_opcode = Js::OpCode::BailOut;
            GenerateBailOut(instrBailOut);
        }

        if (!baseValueType.IsObject())
        {
            // Likely native array: do a vtable check and bail if it fails.
            Assert(labelBailOut);
            GenerateArrayTest(baseOpnd, labelBailOut, labelBailOut, stElem, true);
        }

        if (stElem->GetSrc1()->GetType() == TyVar)
        {
            // Storing a non-specialized value. This may cause array conversion, which invalidates all the code
            // that depends on the array check we've already done.
            // Call a helper that returns the type ID of the resulting array, check it here against the one we
            // expect, and bail if it fails.

            Assert(labelBailOut);

            // Call a helper to (try and) unbox the var and store it.
            // If we had to convert the array to do the store, we'll bail.
            LoadScriptContext(stElem);

            m_lowererMD.LoadHelperArgument(stElem, stElem->UnlinkSrc1());

            IR::IntConstOpnd * intConstIndexOpnd = IR::IntConstOpnd::New(value, TyUint32, m_func);

            m_lowererMD.LoadHelperArgument(stElem, intConstIndexOpnd);
            m_lowererMD.LoadHelperArgument(stElem, indirOpnd->UnlinkBaseOpnd());

            IR::JnHelperMethod helperMethod;
            if (baseValueType.HasIntElements())
            {
                helperMethod = IR::HelperScrArr_SetNativeIntElementC;
            }
            else
            {
                helperMethod = IR::HelperScrArr_SetNativeFloatElementC;
            }

            IR::Instr *instrInsertBranch = stElem->m_next;
            IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyUint32, m_func);
            stElem->ReplaceDst(typeIdOpnd);
            m_lowererMD.ChangeToHelperCall(stElem, helperMethod);

            InsertCompareBranch(
                typeIdOpnd,
                IR::IntConstOpnd::New(
                    baseValueType.HasIntElements() ?
                    Js::TypeIds_NativeIntArray : Js::TypeIds_NativeFloatArray, TyUint32, m_func),
                Js::OpCode::BrNeq_A,
                labelBailOut,
                instrInsertBranch);

            return instrPrev;
        }
        else if (baseValueType.HasIntElements() && labelBailOut)
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
            IR::Opnd* missingElementOpnd = GetMissingItemOpnd(stElem->GetSrc1()->GetType(), m_func);
            if (!stElem->GetSrc1()->IsEqual(missingElementOpnd))
            {
                InsertMissingItemCompareBranch(stElem->GetSrc1(), Js::OpCode::BrEq_A, labelBailOut, stElem);
            }
            else
            {
                //Its a missing value store and data flow proves that src1 is always missing value. Array cannot be an int array at the first place
                //if this code was ever hit. Just bailout, this code path would be updated with the profile information next time around.
                InsertBranch(Js::OpCode::Br, labelBailOut, stElem);
#if DBG
                labelBailOut->m_noHelperAssert = true;
#endif
                stElem->Remove();
                return instrPrev;
            }
        }
        else
        {
            Assert(stElem->GetSrc1()->GetType() == GetArrayIndirType(baseValueType));
        }
        stElem->GetDst()->SetType(stElem->GetSrc1()->GetType());
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);

        if(baseValueType.HasIntElements())
        {
            base = sizeof(Js::JavascriptNativeIntArray) + offsetof(Js::SparseArraySegment<int32>, elements);
        }
        else
        {
            base = sizeof(Js::JavascriptNativeFloatArray) + offsetof(Js::SparseArraySegment<double>, elements);
        }
    }
    else if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::Array)
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC);
        Assert(value <= Js::SparseArraySegmentBase::INLINE_CHUNK_SIZE);
        base = sizeof(Js::JavascriptArray) + offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    else
    {
        Assert(stElem->m_opcode == Js::OpCode::StElemC || stElem->m_opcode == Js::OpCode::StArrSegElemC);
        Assert(indirOpnd->GetBaseOpnd()->GetType() == TyVar);
        base = offsetof(Js::SparseArraySegment<Js::Var>, elements);
    }
    Assert(value >= 0);

    //  MOV [r3 + offset(element) + index], src
    const BYTE indirScale =
        baseValueType.IsLikelyAnyOptimizedArray() ? GetArrayIndirScale(baseValueType) : m_lowererMD.GetDefaultIndirScale();
    IntConstType offset = base + (value << indirScale);
    Assert(Math::FitsInDWord(offset));
    indirOpnd->SetOffset((int32)offset);
    m_lowererMD.ChangeToWriteBarrierAssign(stElem, this->m_func);

    return instrPrev;
}